

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_basics.cpp
# Opt level: O1

void test_3d_static<30ul,30ul,15ul>(void)

{
  long lVar1;
  _Head_base<0UL,_int,_false> *t;
  value_type true_idx;
  tuple<int,_int,_int> dptr [13500];
  _Head_base<1UL,_int,_false> _Stack_2792c;
  _Head_base<2UL,_int,_false> _Stack_27928;
  _Head_base<0UL,_int,_false> _Stack_27924;
  tuple<int,_int,_int> *ptStack_27920;
  tuple<int,_int,_int> *ptStack_27918;
  tuple<int,_int,_int> *ptStack_27910;
  tuple<int,_int,_int> atStack_27908 [13500];
  
  ptStack_27920._0_1_ = 1;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x106,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 15UL]",(bool *)atStack_27908,
             (bool *)&ptStack_27920);
  ptStack_27920._0_1_ = 0;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(0))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x108,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 15UL]",(bool *)atStack_27908,
             (bool *)&ptStack_27920);
  ptStack_27920._0_1_ = 0;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(1))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x109,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 15UL]",(bool *)atStack_27908,
             (bool *)&ptStack_27920);
  ptStack_27920 = (tuple<int,_int,_int> *)((ulong)ptStack_27920._1_7_ << 8);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(2))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x10a,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 15UL]",(bool *)atStack_27908,
             (bool *)&ptStack_27920);
  ptStack_27920 = (tuple<int,_int,_int> *)CONCAT44(ptStack_27920._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x10c,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 15UL]",
             (unsigned_long *)atStack_27908,(int *)&ptStack_27920);
  ptStack_27920 = (tuple<int,_int,_int> *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(1))","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x10d,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 15UL]",
             (unsigned_long *)atStack_27908,(unsigned_long *)&ptStack_27920);
  ptStack_27920 = (tuple<int,_int,_int> *)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(2))","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x10e,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 15UL]",
             (unsigned_long *)atStack_27908,(unsigned_long *)&ptStack_27920);
  ptStack_27920 = (tuple<int,_int,_int> *)0x34bc;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y * Z",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x110,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 15UL]",
             (unsigned_long *)atStack_27908,(unsigned_long *)&ptStack_27920);
  ptStack_27920 = (tuple<int,_int,_int> *)0x34bc;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y * Z",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x111,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 15UL]",
             (unsigned_long *)atStack_27908,(unsigned_long *)&ptStack_27920);
  memset(atStack_27908,0,0x278d0);
  _Stack_27928._M_head_impl = 0;
  do {
    _Stack_2792c._M_head_impl = 0;
    do {
      _Stack_27924._M_head_impl = 0;
      do {
        ptStack_27920 =
             (tuple<int,_int,_int> *)
             ((long)_Stack_27928._M_head_impl * 900 +
             (long)_Stack_2792c._M_head_impl * 0x1e + (ulong)(uint)_Stack_27924._M_head_impl);
        ptStack_27918 = ptStack_27920;
        boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                  ("(l.index(i, j, k))","true_idx",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x11c,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 15UL]",
                   (unsigned_long *)&ptStack_27918,(unsigned_long *)&ptStack_27920);
        ptStack_27918 =
             atStack_27908 +
             (long)_Stack_2792c._M_head_impl * 0x1e + (long)_Stack_27924._M_head_impl +
             (long)_Stack_27928._M_head_impl * 900;
        ptStack_27910 = atStack_27908 + (long)ptStack_27920;
        boost::detail::test_eq_impl<std::tuple<int,int,int>*,std::tuple<int,int,int>*>
                  ("&(dptr[l.index(i, j, k)])","&(dptr[true_idx])",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x11e,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 15UL]",&ptStack_27918,
                   &ptStack_27910);
        lVar1 = (long)_Stack_2792c._M_head_impl * 0x1e + (long)_Stack_27924._M_head_impl +
                (long)_Stack_27928._M_head_impl * 900;
        t = &atStack_27908[lVar1].super__Tuple_impl<0UL,_int,_int,_int>.
             super__Head_base<0UL,_int,_false>;
        t->_M_head_impl = _Stack_27924._M_head_impl;
        atStack_27908[lVar1].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl = _Stack_2792c._M_head_impl;
        atStack_27908[lVar1].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
        super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false> =
             (_Head_base<2UL,_int,_false>)_Stack_27928._M_head_impl;
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<0>(dptr[l.index(i, j, k)]))","i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x124,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 15UL]",&t->_M_head_impl,
                   &_Stack_27924._M_head_impl);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<1>(dptr[l.index(i, j, k)]))","j",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x125,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 15UL]",
                   &atStack_27908
                    [(long)_Stack_2792c._M_head_impl * 0x1e + (long)_Stack_27924._M_head_impl +
                     (long)_Stack_27928._M_head_impl * 900].super__Tuple_impl<0UL,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl,
                   &_Stack_2792c._M_head_impl);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<2>(dptr[l.index(i, j, k)]))","k",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x126,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 15UL]",
                   (int *)(atStack_27908 +
                          (long)_Stack_2792c._M_head_impl * 0x1e + (long)_Stack_27924._M_head_impl +
                          (long)_Stack_27928._M_head_impl * 900),&_Stack_27928._M_head_impl);
        _Stack_27924._M_head_impl = _Stack_27924._M_head_impl + 1;
      } while ((uint)_Stack_27924._M_head_impl < 0x1e);
      _Stack_2792c._M_head_impl = _Stack_2792c._M_head_impl + 1;
    } while ((uint)_Stack_2792c._M_head_impl < 0x1e);
    _Stack_27928._M_head_impl = _Stack_27928._M_head_impl + 1;
  } while ((uint)_Stack_27928._M_head_impl < 0xf);
  return;
}

Assistant:

void test_3d_static()
{ // {{{
    layout_mapping_left<
        dimensions<X, Y, Z>, dimensions<1, 1, 1>, dimensions<0, 0, 0>
    >  const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.is_dynamic_stride(0)), false);
    BOOST_TEST_EQ((l.is_dynamic_stride(1)), false);
    BOOST_TEST_EQ((l.is_dynamic_stride(2)), false);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), X);
    BOOST_TEST_EQ((l.stride(2)), X * Y);

    BOOST_TEST_EQ((l.size()), X * Y * Z);
    BOOST_TEST_EQ((l.span()), X * Y * Z);

    tuple<int, int, int> dptr[X * Y * Z];

    // Set all elements to a unique value.
    for (auto k = 0; k < l[2]; ++k)
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0]) * (j) + (l[0]) * (l[1]) * (k);

        BOOST_TEST_EQ((l.index(i, j, k)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j, k)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j, k)]) = i;
        std::get<1>(dptr[l.index(i, j, k)]) = j;
        std::get<2>(dptr[l.index(i, j, k)]) = k;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j, k)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j, k)])), j); 
        BOOST_TEST_EQ((std::get<2>(dptr[l.index(i, j, k)])), k); 
    }
}